

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  ushort uVar1;
  long lVar2;
  size_t sVar3;
  unsigned_short vtsize;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  ushort uVar7;
  char *__s;
  double t;
  
  lVar2 = -(long)*this;
  uVar1 = *(ushort *)((long)this - (long)*this);
  if (uVar1 < 7) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)this + lVar2 + 6);
  }
  if (uVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)((long)this + (ulong)*(uint *)((long)this + (ulong)uVar7) + (ulong)uVar7);
  }
  iVar6 = 0;
  uVar7 = 0;
  if (4 < *(ushort *)((long)piVar4 - (long)*piVar4)) {
    uVar7 = *(ushort *)((long)piVar4 + (4 - (long)*piVar4));
  }
  if (uVar7 != 0) {
    iVar6 = (int)*(char *)((long)piVar4 + (ulong)uVar7);
  }
  if (iVar6 - 0xbU < 2) {
    if (uVar1 < 0xf) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)this + lVar2 + 0xe);
    }
    if (uVar1 == 0) {
      t = 0.0;
    }
    else {
      t = *(double *)((long)this + (ulong)uVar1);
    }
    FloatToString<double>(__return_storage_ptr__,t,0xc);
  }
  else {
    if (iVar6 == 2) {
      if (uVar1 < 0xd) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(ushort *)((long)this + lVar2 + 0xc);
      }
      if (uVar1 == 0) {
        __s = "false";
      }
      else {
        __s = "true";
        if (*(long *)((long)this + (ulong)uVar1) == 0) {
          __s = "false";
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar3 = strlen(__s);
      pcVar5 = __s + sVar3;
    }
    else {
      if (iVar6 - 1U < 0xc) {
        if (uVar1 < 0xd) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)((long)this + lVar2 + 0xc);
        }
        if (uVar1 == 0) {
          lVar2 = 0;
        }
        else {
          lVar2 = *(long *)((long)this + (ulong)uVar1);
        }
        NumToString<long>(__return_storage_ptr__,lVar2);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __s = "0";
      pcVar5 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsFloatingPoint(base_type)) {
      return NumToString(field->default_real());
    }
    if (IsBool(base_type)) {
      return field->default_integer() ? "true" : "false";
    }
    if (IsScalar(base_type)) { return NumToString((field->default_integer())); }
    // represents offsets
    return "0";
  }